

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

bool __thiscall despot::Variable::HasValue(Variable *this,string *value)

{
  pointer pbVar1;
  size_t sVar2;
  size_t __n;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  size_type *psVar7;
  bool bVar8;
  
  pbVar1 = (this->values_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->values_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  bVar8 = lVar4 != 0;
  if (bVar8) {
    uVar5 = lVar4 >> 5;
    sVar2 = value->_M_string_length;
    psVar7 = &pbVar1->_M_string_length;
    uVar6 = 1;
    do {
      __n = *psVar7;
      if (__n == sVar2) {
        if (__n == 0) {
          return bVar8;
        }
        iVar3 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (psVar7 + -1))->_M_dataplus)._M_p,(value->_M_dataplus)._M_p,__n);
        if (iVar3 == 0) {
          return bVar8;
        }
      }
      bVar8 = uVar6 < uVar5;
      psVar7 = psVar7 + 4;
      lVar4 = uVar6 + (-(ulong)(uVar5 == 0) - uVar5);
      uVar6 = uVar6 + 1;
    } while (lVar4 != 0);
  }
  return bVar8;
}

Assistant:

const bool Variable::HasValue(string value) const {
	for (int i = 0; i < values_.size(); i++)
		if (values_[i] == value)
			return true;
	return false;
}